

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  undefined8 uVar1;
  Vector3f d;
  Normal3f n_00;
  Vector3f wi;
  bool bVar2;
  size_t sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long in_RDX;
  RealisticCamera *in_RDI;
  Float FVar6;
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  Point3f PVar11;
  Vector3<float> VVar12;
  Float eta_t;
  Float eta_i;
  Vector3f wt;
  Float r2;
  Point3f pHit;
  Float zCenter;
  Float radius;
  bool isStop;
  Normal3f n;
  Float t;
  LensElementInterface *element;
  size_t i;
  Ray rLens;
  Transform LensFromCamera;
  Float elementZ;
  float y;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar14;
  undefined4 local_228;
  float fVar15;
  undefined4 in_stack_fffffffffffffe08;
  Float in_stack_fffffffffffffe0c;
  float in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined8 local_1e4;
  float local_1dc;
  Float in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  float local_120;
  float local_108;
  float fStack_104;
  float in_stack_ffffffffffffff04;
  Float in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  Float in_stack_ffffffffffffff14;
  size_type index;
  float local_c8;
  float local_bc;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Float *in_stack_ffffffffffffff58;
  Ray *in_stack_ffffffffffffff60;
  Float in_stack_ffffffffffffff6c;
  Float in_stack_ffffffffffffff70;
  Float *in_stack_ffffffffffffff98;
  Ray *in_stack_ffffffffffffffa0;
  Transform *in_stack_ffffffffffffffa8;
  float local_24;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  
  FVar6 = LensFrontZ(in_RDI);
  local_24 = -FVar6;
  Scale((Float)((ulong)in_stack_fffffffffffffe90 >> 0x20),(Float)in_stack_fffffffffffffe90,
        in_stack_fffffffffffffe8c);
  Transform::operator()
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  index = 0;
  while( true ) {
    local_228 = (undefined4)index;
    fVar15 = (float)(index >> 0x20);
    sVar3 = pstd::
            vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
            ::size(&in_RDI->elementInterfaces);
    if (sVar3 <= CONCAT44(fVar15,local_228)) {
      if (in_RDX != 0) {
        y = -0.0;
        FVar6 = -0.0;
        uVar13 = 0x80000000;
        uVar14 = 0x80000000;
        Point3<float>::Point3((Point3<float> *)&DAT_8000000080000000,-0.0,-0.0,0.0);
        Vector3<float>::Vector3((Vector3<float> *)CONCAT44(uVar14,uVar13),FVar6,y,0.0);
        Medium::TaggedPointer((Medium *)CONCAT44(uVar14,uVar13),(nullptr_t)CONCAT44(FVar6,y));
        PVar11.super_Tuple3<pbrt::Point3,_float>.z = local_1dc;
        PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_1e4;
        d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDI;
        d.super_Tuple3<pbrt::Vector3,_float>.x = fVar15;
        Ray::Ray((Ray *)CONCAT44(uVar14,uVar13),PVar11,d,FVar6,(Medium *)0x86c753);
        Ray::operator=((Ray *)CONCAT44(uVar14,uVar13),(Ray *)CONCAT44(FVar6,y));
      }
      return 1.0;
    }
    pvVar4 = pstd::
             vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             ::operator[](&in_RDI->elementInterfaces,index);
    Normal3<float>::Normal3((Normal3<float> *)0x86c1f2);
    bVar2 = pvVar4->curvatureRadius == 0.0;
    in_stack_ffffffffffffff0c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff0c);
    if (bVar2) {
      if ((local_24 - local_c8) / local_bc < 0.0) {
        return 0.0;
      }
    }
    else {
      in_stack_ffffffffffffff08 = pvVar4->curvatureRadius;
      in_stack_ffffffffffffff04 = local_24 + pvVar4->curvatureRadius;
      bVar2 = IntersectSphericalElement
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         (Normal3f *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (!bVar2) {
        return 0.0;
      }
    }
    auVar10 = (undefined1  [56])0x0;
    PVar11 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             in_stack_fffffffffffffe0c);
    local_c8 = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
    auVar7._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar10;
    uVar1 = vmovlpd_avx(auVar7._0_16_);
    local_108 = (float)uVar1;
    fStack_104 = (float)((ulong)uVar1 >> 0x20);
    if (pvVar4->apertureRadius * pvVar4->apertureRadius <
        local_108 * local_108 + fStack_104 * fStack_104) break;
    if ((in_stack_ffffffffffffff0c & 0x1000000) == 0) {
      fVar15 = local_c8;
      Vector3<float>::Vector3((Vector3<float> *)0x86c3cd);
      if (index != 0) {
        pvVar5 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[](&in_RDI->elementInterfaces,index - 1);
        if ((pvVar5->eta != 0.0) || (NAN(pvVar5->eta))) {
          pstd::
          vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          ::operator[](&in_RDI->elementInterfaces,index - 1);
        }
      }
      pvVar5 = pstd::
               vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               ::operator[](&in_RDI->elementInterfaces,index);
      if ((pvVar5->eta != 0.0) || (NAN(pvVar5->eta))) {
        pstd::
        vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
        ::operator[](&in_RDI->elementInterfaces,index);
      }
      auVar10 = (undefined1  [56])0x0;
      VVar12 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      auVar8._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar10;
      vmovlpd_avx(auVar8._0_16_);
      auVar10 = ZEXT856(0);
      VVar12.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffe0c;
      VVar12.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe08;
      VVar12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe10;
      VVar12 = Normalize<float>(VVar12);
      auVar9._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar10;
      vmovlpd_avx(auVar9._0_16_);
      wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffff4c;
      wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffff48;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffff50;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = local_108;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)index;
      n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)(index >> 0x20);
      bVar2 = Refract(wi,n_00,in_stack_ffffffffffffff14,
                      (Float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (Vector3f *)CONCAT44(in_stack_ffffffffffffff04,fVar15));
      if (!bVar2) {
        return 0.0;
      }
      local_bc = local_120;
    }
    local_24 = pvVar4->thickness + local_24;
    index = index + 1;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, nullptr, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}